

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEFStreamObjectHelper.cc
# Opt level: O3

void __thiscall
QPDFEFStreamObjectHelper::setParam
          (QPDFEFStreamObjectHelper *this,string *pkey,QPDFObjectHandle *pval)

{
  undefined8 this_00;
  bool bVar1;
  undefined1 local_98 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  QPDFObjectHandle local_60;
  undefined1 local_50 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  local_98._0_8_ =
       (this->super_QPDFObjectHelper).super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_98._8_8_ =
       (this->super_QPDFObjectHelper).super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_)->_M_use_count + 1;
    }
  }
  QPDFObjectHandle::getDict((QPDFObjectHandle *)(local_98 + 0x10));
  local_60.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"/Params","");
  QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_78,(string *)(local_98 + 0x10));
  if (local_60.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)local_50) {
    operator_delete(local_60.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    local_50._0_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._24_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
  }
  bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)&local_78);
  if (!bVar1) {
    local_50._16_8_ =
         (this->super_QPDFObjectHelper).super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_38 = (this->super_QPDFObjectHelper).super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_38->_M_use_count = local_38->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_38->_M_use_count = local_38->_M_use_count + 1;
      }
    }
    QPDFObjectHandle::getDict((QPDFObjectHandle *)local_98);
    local_60.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"/Params","");
    QPDFObjectHandle::newDictionary();
    QPDFObjectHandle::replaceKeyAndGetNew
              ((QPDFObjectHandle *)(local_98 + 0x10),(string *)local_98,&local_60);
    this_00 = local_78._8_8_;
    local_78._8_8_ = local_98._24_8_;
    local_78._M_allocated_capacity = local_98._16_8_;
    local_98._16_8_ = 0;
    local_98._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._24_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._24_8_);
      }
    }
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
    if (local_60.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)local_50) {
      operator_delete(local_60.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      local_50._0_8_ + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
  }
  QPDFObjectHandle::replaceKey((QPDFObjectHandle *)&local_78,pkey,pval);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
  }
  return;
}

Assistant:

void
QPDFEFStreamObjectHelper::setParam(std::string const& pkey, QPDFObjectHandle const& pval)
{
    auto params = oh().getDict().getKey("/Params");
    if (!params.isDictionary()) {
        params = oh().getDict().replaceKeyAndGetNew("/Params", QPDFObjectHandle::newDictionary());
    }
    params.replaceKey(pkey, pval);
}